

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFrameBuffer.cpp
# Opt level: O0

Slice * __thiscall Imf_3_2::FrameBuffer::findSlice(FrameBuffer *this,string *name)

{
  Slice *pSVar1;
  char *in_stack_00000108;
  FrameBuffer *in_stack_00000110;
  
  std::__cxx11::string::c_str();
  pSVar1 = findSlice(in_stack_00000110,in_stack_00000108);
  return pSVar1;
}

Assistant:

const Slice*
FrameBuffer::findSlice (const string& name) const
{
    return findSlice (name.c_str ());
}